

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::BeginFunctionBody
          (BinaryReaderObjdumpDisassemble *this,Index index,Offset size)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  ulong uVar3;
  
  uVar3 = (ulong)index;
  printf("%06zx func[%u]",
         ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
         state)->offset,uVar3);
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  pbVar2 = (pOVar1->function_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(pOVar1->function_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    if (pbVar2[uVar3]._M_string_length != 0) {
      printf(" <%.*s>",pbVar2[uVar3]._M_string_length,pbVar2[uVar3]._M_dataplus._M_p);
    }
  }
  puts(":");
  this->last_opcode_end = 0;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::BeginFunctionBody(Index index,
                                                         Offset size) {
  printf("%06" PRIzx " func[%" PRIindex "]", state->offset, index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    printf(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  printf(":\n");

  last_opcode_end = 0;
  return Result::Ok;
}